

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_getstr(Table *t,TString *key)

{
  Node *pNVar1;
  
  pNVar1 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & (key->tsv).hash);
  while (((pNVar1->i_key).nk.tt_ != 0x44 || ((pNVar1->i_key).nk.value_.gc != (GCObject *)key))) {
    pNVar1 = *(Node **)((long)&pNVar1->i_key + 0x10);
    if (pNVar1 == (Node *)0x0) {
      return &luaO_nilobject_;
    }
  }
  return &pNVar1->i_val;
}

Assistant:

const TValue *luaH_getstr (Table *t, TString *key) {
  Node *n = hashstr(t, key);
  lua_assert(key->tsv.tt == LUA_TSHRSTR);
  do {  /* check whether `key' is somewhere in the chain */
    if (ttisshrstring(gkey(n)) && eqshrstr(rawtsvalue(gkey(n)), key))
      return gval(n);  /* that's it */
    else n = gnext(n);
  } while (n);
  return luaO_nilobject;
}